

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O1

ONX_ErrorCounter * __thiscall
ONX_ErrorCounter::operator+
          (ONX_ErrorCounter *__return_storage_ptr__,ONX_ErrorCounter *this,ONX_ErrorCounter *rhs)

{
  uint uVar1;
  
  __return_storage_ptr__->m_failure_count = 0;
  __return_storage_ptr__->m_error_count = 0;
  __return_storage_ptr__->m_warning_count = 0;
  __return_storage_ptr__->m_state_bit_field = 0;
  __return_storage_ptr__->m_opennurbs_library_error_count = 0;
  __return_storage_ptr__->m_opennurbs_library_warning_count = 0;
  __return_storage_ptr__->m_failure_count = rhs->m_failure_count + this->m_failure_count;
  __return_storage_ptr__->m_error_count = rhs->m_error_count + this->m_error_count;
  __return_storage_ptr__->m_warning_count = rhs->m_warning_count + this->m_warning_count;
  __return_storage_ptr__->m_state_bit_field = rhs->m_state_bit_field | this->m_state_bit_field;
  uVar1 = rhs->m_opennurbs_library_error_count;
  if (rhs->m_opennurbs_library_error_count < this->m_opennurbs_library_error_count) {
    uVar1 = this->m_opennurbs_library_error_count;
  }
  __return_storage_ptr__->m_opennurbs_library_error_count = uVar1;
  uVar1 = rhs->m_opennurbs_library_warning_count;
  if (rhs->m_opennurbs_library_warning_count < this->m_opennurbs_library_warning_count) {
    uVar1 = this->m_opennurbs_library_warning_count;
  }
  __return_storage_ptr__->m_opennurbs_library_warning_count = uVar1;
  return __return_storage_ptr__;
}

Assistant:

const ONX_ErrorCounter ONX_ErrorCounter::operator+ (
  const ONX_ErrorCounter& rhs
  )
{
  ONX_ErrorCounter sum;
  sum.m_failure_count = m_failure_count + rhs.m_failure_count;
  sum.m_error_count = m_error_count + rhs.m_error_count;
  sum.m_warning_count = m_warning_count + rhs.m_warning_count;


  sum.m_state_bit_field = m_state_bit_field | rhs.m_state_bit_field;
  sum.m_opennurbs_library_error_count
    = (m_opennurbs_library_error_count < rhs.m_opennurbs_library_error_count)
    ? rhs.m_opennurbs_library_error_count
    : m_opennurbs_library_error_count;
  sum.m_opennurbs_library_warning_count
    = (m_opennurbs_library_warning_count < rhs.m_opennurbs_library_warning_count)
    ? rhs.m_opennurbs_library_warning_count
    : m_opennurbs_library_warning_count;

  return sum;
}